

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# po_man.cpp
# Opt level: O2

bool __thiscall FPolyObj::CheckMobjBlocking(FPolyObj *this,side_t *sd)

{
  uint uVar1;
  line_t_conflict *linedef;
  FBlockNode *pFVar2;
  int iVar3;
  undefined1 auVar4 [16];
  bool bVar5;
  long lVar6;
  bool bVar7;
  int iVar8;
  undefined8 extraout_RAX;
  ulong uVar9;
  undefined4 extraout_EDX;
  uint uVar10;
  FBlockNode **ppFVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  double dVar14;
  AActor *mobj;
  AActor *local_150;
  double local_148;
  int local_140;
  int local_13c;
  undefined8 local_138;
  side_t *local_130;
  long local_128;
  undefined8 uStack_120;
  DVector2 local_118;
  long local_108;
  FPolyObj *local_100;
  long local_f8;
  long local_f0;
  DVector3 local_e8;
  double local_d0;
  FLineOpening local_c8;
  
  local_100 = this;
  if ((CheckMobjBlocking(side_t*)::checker == '\0') &&
     (iVar8 = __cxa_guard_acquire(&CheckMobjBlocking(side_t*)::checker), iVar8 != 0)) {
    CheckMobjBlocking::checker = (TArray<AActor_*,_AActor_*>)ZEXT816(0);
    __cxa_atexit(TArray<AActor_*,_AActor_*>::~TArray,&CheckMobjBlocking::checker,&__dso_handle);
    __cxa_guard_release(&CheckMobjBlocking(side_t*)::checker);
  }
  linedef = sd->linedef;
  uStack_120 = CONCAT44((int)((linedef->bbox[3] - bmaporgx) * 0.0078125),
                        (int)((linedef->bbox[2] - bmaporgx) * 0.0078125));
  local_128 = CONCAT44((int)((linedef->bbox[1] - bmaporgy) * 0.0078125),
                       (int)((linedef->bbox[0] - bmaporgy) * 0.0078125));
  local_130 = sd;
  TArray<AActor_*,_AActor_*>::Clear(&CheckMobjBlocking::checker);
  auVar4._8_8_ = uStack_120;
  auVar4._0_8_ = local_128;
  auVar13._0_4_ = -(uint)(0 < (int)local_128);
  auVar13._4_4_ = -(uint)(0 < (int)((ulong)local_128 >> 0x20));
  auVar13._8_4_ = -(uint)(0 < (int)uStack_120);
  auVar13._12_4_ = -(uint)(0 < (int)((ulong)uStack_120 >> 0x20));
  auVar13 = auVar13 & auVar4;
  auVar12._0_4_ = -(uint)(auVar13._0_4_ < bmapheight);
  auVar12._4_4_ = -(uint)(auVar13._4_4_ < bmapheight);
  auVar12._8_4_ = -(uint)(auVar13._8_4_ < bmapwidth);
  auVar12._12_4_ = -(uint)(auVar13._12_4_ < bmapwidth);
  uVar10 = movmskps(extraout_EDX,auVar12);
  local_13c = auVar13._4_4_;
  if ((uVar10 & 2) == 0) {
    local_13c = bmapheight + -1;
  }
  local_140 = auVar13._0_4_;
  if ((uVar10 & 1) == 0) {
    local_140 = bmapheight + -1;
  }
  iVar8 = auVar13._8_4_;
  if ((uVar10 & 4) == 0) {
    iVar8 = bmapwidth + -1;
  }
  iVar3 = auVar13._12_4_;
  if ((uVar10 & 8) == 0) {
    iVar3 = bmapwidth + -1;
  }
  local_13c = local_13c * bmapwidth;
  local_108 = (long)iVar8;
  local_f0 = (long)iVar3;
  local_138 = 0;
  do {
    if (bmapwidth * local_140 < local_13c) {
      return (bool)((byte)local_138 & 1);
    }
    local_f8 = (long)local_13c;
    for (local_128 = local_108; local_128 <= local_f0; local_128 = local_128 + 1) {
      ppFVar11 = blocklinks + local_128 + local_f8;
      while (pFVar2 = *ppFVar11, pFVar2 != (FBlockNode *)0x0) {
        local_150 = pFVar2->Me;
        uVar9 = (ulong)CheckMobjBlocking::checker.Count;
        do {
          if ((int)uVar9 < 1) {
            TArray<AActor_*,_AActor_*>::Push(&CheckMobjBlocking::checker,&local_150);
            uVar10 = (local_150->flags).Value;
            if ((uVar10 & 0x1002) != 2) break;
            local_c8.top = 3.4028234663852886e+38;
            local_c8.bottom = -3.4028234663852886e+38;
            bVar5 = true;
            if ((((((linedef->backsector != (sector_t_conflict *)0x0) &&
                   (uVar1 = linedef->flags, (uVar1 & 0x8001) == 0)) &&
                  (((uVar1 >> 0xe & 1) == 0 || (local_150->player == (player_t *)0x0)))) &&
                 (((uVar1 & 2) == 0 || (((local_150->flags3).Value & 0x2000) == 0)))) &&
                (((uVar10 >> 0xe & 1) == 0 || ((uVar1 & 0x40000) == 0)))) &&
               ((((uVar1 >> 0x15 & 1) == 0 ||
                 ((bVar7 = P_LineOpening_3dMidtex(local_150,linedef,&local_c8,false), !bVar7 &&
                  ((local_150->__Pos).Z + local_150->Height < local_c8.top)))) ||
                ((local_c8.abovemidtex == true &&
                 (dVar14 = (local_150->__Pos).Z,
                 local_150->floorz <= dVar14 && dVar14 != local_150->floorz)))))) {
              bVar5 = false;
            }
            AActor::PosRelative(&local_e8,local_150,linedef);
            local_e8.Z = local_150->radius;
            dVar14 = local_e8.Y + local_e8.Z;
            local_d0 = local_e8.X + local_e8.Z;
            local_e8.Y = local_e8.Y - local_e8.Z;
            local_e8.Z = local_e8.X - local_e8.Z;
            local_e8.X = dVar14;
            bVar7 = FBoundingBox::inRange((FBoundingBox *)&local_e8,linedef);
            if ((!bVar7) ||
               (iVar8 = FBoundingBox::BoxOnLineSide((FBoundingBox *)&local_e8,(line_t *)linedef),
               iVar8 != -1)) break;
            bVar7 = line_t::isLinePortal((line_t *)linedef);
            if (bVar7) {
              local_118.X = (local_150->__Pos).X;
              local_118.Y = (local_150->__Pos).Y;
              bVar7 = P_TryMove(local_150,&local_118,0,(secplane_t *)0x0);
              if (bVar7) break;
            }
            if (linedef->sidedef[1] == (side_t *)0x0) {
              if (!bVar5) break;
            }
            else {
              local_118.X = (local_150->__Pos).X;
              local_118.Y = (local_150->__Pos).Y;
              iVar8 = P_PointOnLineSidePrecise(&local_118,linedef);
              if (linedef->sidedef[iVar8] != local_130) break;
              if (!bVar5) {
                local_148 = (local_150->__Pos).Z;
                dVar14 = secplane_t::ZatPoint
                                   (&linedef->sidedef[iVar8 == 0]->sector->floorplane,local_150);
                if (dVar14 <= local_148) {
                  local_148 = (local_150->__Pos).Z + local_150->Height;
                  dVar14 = secplane_t::ZatPoint
                                     (&linedef->sidedef[iVar8 == 0]->sector->ceilingplane,local_150)
                  ;
                  if (local_148 <= dVar14) break;
                }
              }
            }
            ThrustMobj(local_100,local_150,local_130);
            local_138 = CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
            break;
          }
          lVar6 = uVar9 - 1;
          uVar9 = uVar9 - 1;
        } while (CheckMobjBlocking::checker.Array[lVar6] != local_150);
        ppFVar11 = &pFVar2->NextActor;
      }
    }
    local_13c = local_13c + bmapwidth;
  } while( true );
}

Assistant:

bool FPolyObj::CheckMobjBlocking (side_t *sd)
{
	static TArray<AActor *> checker;
	FBlockNode *block;
	AActor *mobj;
	int i, j, k;
	int left, right, top, bottom;
	line_t *ld;
	bool blocked;
	bool performBlockingThrust;

	ld = sd->linedef;

	top = GetBlockY(ld->bbox[BOXTOP]);
	bottom = GetBlockY(ld->bbox[BOXBOTTOM]);
	left = GetBlockX(ld->bbox[BOXLEFT]);
	right = GetBlockX(ld->bbox[BOXRIGHT]);

	blocked = false;
	checker.Clear();

	bottom = bottom < 0 ? 0 : bottom;
	bottom = bottom >= bmapheight ? bmapheight-1 : bottom;
	top = top < 0 ? 0 : top;
	top = top >= bmapheight  ? bmapheight-1 : top;
	left = left < 0 ? 0 : left;
	left = left >= bmapwidth ? bmapwidth-1 : left;
	right = right < 0 ? 0 : right;
	right = right >= bmapwidth ?  bmapwidth-1 : right;

	for (j = bottom*bmapwidth; j <= top*bmapwidth; j += bmapwidth)
	{
		for (i = left; i <= right; i++)
		{
			for (block = blocklinks[j+i]; block != NULL; block = block->NextActor)
			{
				mobj = block->Me;
				for (k = (int)checker.Size()-1; k >= 0; --k)
				{
					if (checker[k] == mobj)
					{
						break;
					}
				}
				if (k < 0)
				{
					checker.Push (mobj);
					if ((mobj->flags&MF_SOLID) && !(mobj->flags&MF_NOCLIP))
					{
						FLineOpening open;
						open.top = LINEOPEN_MAX;
						open.bottom = LINEOPEN_MIN;
						// [TN] Check wether this actor gets blocked by the line.
						if (ld->backsector != NULL &&
							!(ld->flags & (ML_BLOCKING|ML_BLOCKEVERYTHING))
							&& !(ld->flags & ML_BLOCK_PLAYERS && mobj->player) 
							&& !(ld->flags & ML_BLOCKMONSTERS && mobj->flags3 & MF3_ISMONSTER)
							&& !((mobj->flags & MF_FLOAT) && (ld->flags & ML_BLOCK_FLOATERS))
							&& (!(ld->flags & ML_3DMIDTEX) ||
								(!P_LineOpening_3dMidtex(mobj, ld, open) &&
									(mobj->Top() < open.top)
								) || (open.abovemidtex && mobj->Z() > mobj->floorz))
							)
						{
							// [BL] We can't just continue here since we must
							// determine if the line's backsector is going to
							// be blocked.
							performBlockingThrust = false;
						}
						else
						{
							performBlockingThrust = true;
						}

						DVector2 pos = mobj->PosRelative(ld);
						FBoundingBox box(pos.X, pos.Y, mobj->radius);

						if (!box.inRange(ld) || box.BoxOnLineSide(ld) != -1)
						{
							continue;
						}

						if (ld->isLinePortal())
						{
							// Fixme: this still needs to figure out if the polyobject move made the player cross the portal line.
							if (P_TryMove(mobj, mobj->Pos(), false))
							{
								continue;
							}
						}
						// We have a two-sided linedef so we should only check one side
						// so that the thrust from both sides doesn't cancel each other out.
						// Best use the one facing the player and ignore the back side.
						if (ld->sidedef[1] != NULL)
						{
							int side = P_PointOnLineSidePrecise(mobj->Pos(), ld);
							if (ld->sidedef[side] != sd)
							{
								continue;
							}
							// [BL] See if we hit below the floor/ceiling of the poly.
							else if(!performBlockingThrust && (
									mobj->Z() < ld->sidedef[!side]->sector->GetSecPlane(sector_t::floor).ZatPoint(mobj) ||
									mobj->Top() > ld->sidedef[!side]->sector->GetSecPlane(sector_t::ceiling).ZatPoint(mobj)
								))
							{
								performBlockingThrust = true;
							}
						}

						if(performBlockingThrust)
						{
							ThrustMobj (mobj, sd);
							blocked = true;
						}
						else
							continue;
					}
				}
			}
		}
	}
	return blocked;
}